

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  uint *puVar1;
  TValue *pTVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  
  if (stat == 0) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u64 = 0xffffffffffffffff;
    pcVar5 = strerror(iVar3);
    if (fname == (char *)0x0) {
      lua_pushfstring(L,"%s",pcVar5);
    }
    else {
      lua_pushfstring(L,"%s: %s",fname,pcVar5);
    }
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)iVar3;
    puVar1 = (uint *)((L->glref).ptr64 + 0x3c4);
    *puVar1 = *puVar1 & 0xffffffef;
    iVar3 = 3;
  }
  else {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u64 = 0xfffeffffffffffff;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

LUALIB_API int luaL_fileresult(lua_State *L, int stat, const char *fname)
{
  if (stat) {
    setboolV(L->top++, 1);
    return 1;
  } else {
    int en = errno;  /* Lua API calls may change this value. */
    setnilV(L->top++);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushfstring(L, "%s", strerror(en));
    setintV(L->top++, en);
    lj_trace_abort(G(L));
    return 3;
  }
}